

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

double __thiscall HVectorBase<double>::norm2(HVectorBase<double> *this)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  if (0 < (long)this->count) {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar1 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2]];
      dVar3 = dVar3 + dVar1 * dVar1;
      lVar2 = lVar2 + 1;
    } while (this->count != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

Real HVectorBase<Real>::norm2() const {
  /*
   * Compute the squared 2-norm of the vector
   */
  const HighsInt workCount = count;
  const HighsInt* workIndex = &index[0];
  const Real* workArray = &array[0];

  Real result = Real{0};
  for (HighsInt i = 0; i < workCount; i++) {
    Real value = workArray[workIndex[i]];
    result += value * value;
  }
  return result;
}